

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int parse_rockridge(archive_read *a,file_info *file,uchar *p,uchar *end)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  byte *data_00;
  file_info *in_RCX;
  file_info *file_00;
  byte *in_RDX;
  archive_read *in_RSI;
  long in_RDI;
  int32_t location;
  int version;
  int data_length;
  uchar *data;
  iso9660 *iso9660;
  uchar *in_stack_ffffffffffffffa8;
  int n;
  uint in_stack_ffffffffffffffb8;
  uint uVar5;
  uint32_t in_stack_ffffffffffffffbc;
  file_info *file_01;
  
  file_01 = (file_info *)**(undefined8 **)(in_RDI + 0x948);
  while( true ) {
    uVar5 = in_stack_ffffffffffffffb8 & 0xffffff;
    if (((((file_info *)(in_RDX + 4) <= in_RCX) &&
         (uVar5 = in_stack_ffffffffffffffb8 & 0xffffff, 0x40 < *in_RDX)) &&
        (uVar5 = in_stack_ffffffffffffffb8 & 0xffffff, *in_RDX < 0x5b)) &&
       (((uVar5 = in_stack_ffffffffffffffb8 & 0xffffff, 0x40 < in_RDX[1] &&
         (uVar5 = in_stack_ffffffffffffffb8 & 0xffffff, in_RDX[1] < 0x5b)) &&
        (uVar5 = in_stack_ffffffffffffffb8 & 0xffffff, 3 < in_RDX[2])))) {
      uVar5 = CONCAT13((file_info *)(in_RDX + (int)(uint)in_RDX[2]) <= in_RCX,
                       (int3)in_stack_ffffffffffffffb8);
    }
    if ((char)(uVar5 >> 0x18) == '\0') break;
    data_00 = in_RDX + 4;
    iVar2 = in_RDX[2] - 4;
    bVar1 = in_RDX[3];
    file_00 = (file_info *)(ulong)(*in_RDX - 0x43);
    switch(file_00) {
    case (file_info *)0x0:
      if (in_RDX[1] == 0x45) {
        if ((bVar1 == 1) && (iVar2 == 0x18)) {
          in_stack_ffffffffffffffbc = archive_le32dec(data_00);
          uVar3 = archive_le32dec(data_00 + 8);
          *(uint32_t *)&(in_RSI->archive).error_string.s = uVar3;
          uVar3 = archive_le32dec(data_00 + 0x10);
          *(uint32_t *)((long)&(in_RSI->archive).error_string.s + 4) = uVar3;
          iVar2 = register_CE(in_RSI,(int32_t)((ulong)in_RDX >> 0x20),in_RCX);
          if (iVar2 != 0) {
            return -0x1e;
          }
        }
      }
      else if (((in_RDX[1] == 0x4c) && (bVar1 == 1)) && (iVar2 == 8)) {
        in_stack_ffffffffffffffa8 = (uchar *)(file_01->name).s;
        uVar3 = archive_le32dec(data_00);
        (in_RSI->archive).error_string.buffer_length =
             (long)in_stack_ffffffffffffffa8 * (ulong)uVar3;
        *(undefined1 *)&file_01->key = 1;
      }
      break;
    default:
      break;
    case (file_info *)0xb:
      if ((in_RDX[1] == 0x4d) && (bVar1 == 1)) {
        parse_rockridge_NM1((file_info *)CONCAT44(iVar2,1),
                            (uchar *)CONCAT44(in_stack_ffffffffffffffbc,uVar5),0);
        *(undefined1 *)&file_01->key = 1;
      }
      break;
    case (file_info *)0xd:
      if (in_RDX[1] == 0x4e) {
        if ((bVar1 == 1) && (iVar2 == 0x10)) {
          uVar4 = toi((void *)CONCAT44(in_stack_ffffffffffffffbc,uVar5),0);
          in_RSI->skip_file_dev = (ulong)uVar4;
          in_RSI->skip_file_dev = in_RSI->skip_file_dev << 0x20;
          uVar4 = toi((void *)CONCAT44(in_stack_ffffffffffffffbc,uVar5),
                      (int)((ulong)file_00 >> 0x20));
          in_RSI->skip_file_dev = (ulong)uVar4 | in_RSI->skip_file_dev;
          *(undefined1 *)&file_01->key = 1;
        }
      }
      else if ((in_RDX[1] == 0x58) && (bVar1 == 1)) {
        if (7 < iVar2) {
          uVar4 = toi((void *)CONCAT44(in_stack_ffffffffffffffbc,uVar5),0);
          *(uint *)&in_RSI->skip_file_ino = uVar4;
        }
        n = (int)((ulong)file_00 >> 0x20);
        if (0xf < iVar2) {
          uVar4 = toi((void *)CONCAT44(in_stack_ffffffffffffffbc,uVar5),n);
          *(uint *)&in_RSI->read_data_output_offset = uVar4;
        }
        if (0x17 < iVar2) {
          uVar4 = toi((void *)CONCAT44(in_stack_ffffffffffffffbc,uVar5),n);
          *(uint *)((long)&in_RSI->skip_file_ino + 4) = uVar4;
        }
        if (0x1f < iVar2) {
          uVar4 = toi((void *)CONCAT44(in_stack_ffffffffffffffbc,uVar5),n);
          *(uint *)&in_RSI->read_data_block = uVar4;
        }
        if (0x27 < iVar2) {
          uVar4 = toi((void *)CONCAT44(in_stack_ffffffffffffffbc,uVar5),n);
          in_RSI->read_data_offset = (ulong)uVar4;
        }
        *(undefined1 *)&file_01->key = 1;
      }
      break;
    case (file_info *)0xf:
      if ((in_RDX[1] == 0x45) && (bVar1 == 1)) {
        *(undefined1 *)((long)&(in_RSI->archive).error_string.length + 2) = 1;
        *(undefined1 *)&file_01->key = 1;
      }
      break;
    case (file_info *)0x10:
      if (in_RDX[1] == 0x4c) {
        if (bVar1 == 1) {
          parse_rockridge_SL1(file_01,data_00,iVar2);
          *(undefined1 *)&file_01->key = 1;
        }
      }
      else if (((in_RDX[1] == 0x54) && (iVar2 == 0)) && (bVar1 == 1)) {
        *(undefined1 *)((long)&file_01->key + 1) = 0;
        *(undefined1 *)&file_01->key = 0;
        return 0;
      }
      break;
    case (file_info *)0x11:
      if ((in_RDX[1] == 0x46) && (bVar1 == 1)) {
        parse_rockridge_TF1(file_00,in_stack_ffffffffffffffa8,0);
        *(undefined1 *)&file_01->key = 1;
      }
      break;
    case (file_info *)0x17:
      if ((in_RDX[1] == 0x46) && (bVar1 == 1)) {
        parse_rockridge_ZF1(file_00,in_stack_ffffffffffffffa8,0);
      }
    }
    in_RDX = in_RDX + (int)(uint)in_RDX[2];
    in_stack_ffffffffffffffb8 = uVar5;
  }
  return 0;
}

Assistant:

static int
parse_rockridge(struct archive_read *a, struct file_info *file,
    const unsigned char *p, const unsigned char *end)
{
	struct iso9660 *iso9660;

	iso9660 = (struct iso9660 *)(a->format->data);

	while (p + 4 <= end  /* Enough space for another entry. */
	    && p[0] >= 'A' && p[0] <= 'Z' /* Sanity-check 1st char of name. */
	    && p[1] >= 'A' && p[1] <= 'Z' /* Sanity-check 2nd char of name. */
	    && p[2] >= 4 /* Sanity-check length. */
	    && p + p[2] <= end) { /* Sanity-check length. */
		const unsigned char *data = p + 4;
		int data_length = p[2] - 4;
		int version = p[3];

		switch(p[0]) {
		case 'C':
			if (p[1] == 'E') {
				if (version == 1 && data_length == 24) {
					/*
					 * CE extension comprises:
					 *   8 byte sector containing extension
					 *   8 byte offset w/in above sector
					 *   8 byte length of continuation
					 */
					int32_t location =
					    archive_le32dec(data);
					file->ce_offset =
					    archive_le32dec(data+8);
					file->ce_size =
					    archive_le32dec(data+16);
					if (register_CE(a, location, file)
					    != ARCHIVE_OK)
						return (ARCHIVE_FATAL);
				}
			}
			else if (p[1] == 'L') {
				if (version == 1 && data_length == 8) {
					file->cl_offset = (uint64_t)
					    iso9660->logical_block_size *
					    (uint64_t)archive_le32dec(data);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'N':
			if (p[1] == 'M') {
				if (version == 1) {
					parse_rockridge_NM1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'P':
			/*
			 * PD extension is padding;
			 * contents are always ignored.
			 *
			 * PL extension won't appear;
			 * contents are always ignored.
			 */
			if (p[1] == 'N') {
				if (version == 1 && data_length == 16) {
					file->rdev = toi(data,4);
					file->rdev <<= 32;
					file->rdev |= toi(data + 8, 4);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'X') {
				/*
				 * PX extension comprises:
				 *   8 bytes for mode,
				 *   8 bytes for nlinks,
				 *   8 bytes for uid,
				 *   8 bytes for gid,
				 *   8 bytes for inode.
				 */
				if (version == 1) {
					if (data_length >= 8)
						file->mode
						    = toi(data, 4);
					if (data_length >= 16)
						file->nlinks
						    = toi(data + 8, 4);
					if (data_length >= 24)
						file->uid
						    = toi(data + 16, 4);
					if (data_length >= 32)
						file->gid
						    = toi(data + 24, 4);
					if (data_length >= 40)
						file->number
						    = toi(data + 32, 4);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'R':
			if (p[1] == 'E' && version == 1) {
				file->re = 1;
				iso9660->seenRockridge = 1;
			}
			else if (p[1] == 'R' && version == 1) {
				/*
				 * RR extension comprises:
				 *    one byte flag value
				 * This extension is obsolete,
				 * so contents are always ignored.
				 */
			}
			break;
		case 'S':
			if (p[1] == 'L') {
				if (version == 1) {
					parse_rockridge_SL1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'T'
			    && data_length == 0 && version == 1) {
				/*
				 * ST extension marks end of this
				 * block of SUSP entries.
				 *
				 * It allows SUSP to coexist with
				 * non-SUSP uses of the System
				 * Use Area by placing non-SUSP data
				 * after SUSP data.
				 */
				iso9660->seenSUSP = 0;
				iso9660->seenRockridge = 0;
				return (ARCHIVE_OK);
			}
			break;
		case 'T':
			if (p[1] == 'F') {
				if (version == 1) {
					parse_rockridge_TF1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'Z':
			if (p[1] == 'F') {
				if (version == 1)
					parse_rockridge_ZF1(file,
					    data, data_length);
			}
			break;
		default:
			break;
		}

		p += p[2];
	}
	return (ARCHIVE_OK);
}